

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

int tcdmain(int argc,char **argv,char *save_ext)

{
  uint uVar1;
  osfildef *fp;
  tcderrdef errcbcx;
  errdef fr_;
  errcxdef errctx;
  char vsnbuf [128];
  
  errcbcx.tcderrfil = (FILE *)0x0;
  errcbcx.tcderrtok = (tokcxdef *)0x0;
  errctx.errcxlog = tcdlogerr;
  errctx.errcxlgc = (void *)0x0;
  errcbcx.tcderrlvl = 0;
  errcbcx.tcderrcnt = 0;
  errcbcx.tcdwrncnt = 0;
  errcbcx.tcdfatal = 0;
  errctx.errcxofs = 0;
  errcbcx.tcdwrn_AMBIGBIN = '\x01';
  errcbcx._33_7_ = 0;
  errctx.errcxfp = (osfildef *)0x0;
  errctx.errcxappctx = (appctxdef *)0x0;
  fp = oserrop(*argv);
  errini(&errctx,fp);
  sprintf(vsnbuf,"%s v%s.%s.%s  %s\n",tcgname,vsn_major,vsn_minor,vsn_maint,
          "Copyright (c) 1993, 2012 Michael J. Roberts");
  tcdptf(vsnbuf);
  sprintf(vsnbuf,"TADS for %s [%s] patchlevel %s.%s\n","POSIX/Unix/MS-Windows",
          "POSIX_UNIX_MSWINDOWS","1","0");
  tcdptf(vsnbuf);
  tcdptf("%s maintains this port.\n","Nikos Chantziaras <realnc@gmail.com>");
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  if (fr_.errcode == 0) {
    fr_.errprv = errctx.errcxptr;
    errctx.errcxptr = &fr_;
    tcdmain1(&errctx,argc,argv,&errcbcx,save_ext);
    errctx.errcxptr = fr_.errprv;
    if (errctx.errcxfp != (osfildef *)0x0) {
      fclose((FILE *)errctx.errcxfp);
    }
    if (errcbcx.tcderrfil != (FILE *)0x0) {
      fclose((FILE *)errcbcx.tcderrfil);
    }
    maybe_pause();
    uVar1 = (uint)(errcbcx.tcderrcnt != 0);
  }
  else {
    errctx.errcxptr = fr_.errprv;
    if (fr_.errcode != 0x5dc) {
      (*errctx.errcxlog)(errctx.errcxlgc,fr_.errfac,fr_.errcode,fr_.erraac,fr_.erraav);
    }
    if (errctx.errcxfp != (osfildef *)0x0) {
      fclose((FILE *)errctx.errcxfp);
    }
    maybe_pause();
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int tcdmain(int argc, char **argv, char *save_ext)
{
    errcxdef   errctx;
    int        err;
    osfildef  *fp;
    extern     char tcgname[];
    tcderrdef  errcbcx;                           /* error callback context */
    char       vsnbuf[128];

    /* initialize the error structure */
    CLRSTRUCT(errcbcx);
    errcbcx.tcdwrn_AMBIGBIN = TRUE;                   /* -v+abin by default */

    errctx.errcxlog = tcdlogerr;
    errctx.errcxlgc = (void *)0;
    errctx.errcxofs = 0;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxappctx = 0;
    fp = oserrop(argv[0]);
    errini(&errctx, fp);

    /* copyright-date-string */
    sprintf(vsnbuf, "%s v%s.%s.%s  %s\n", tcgname,
            vsn_major, vsn_minor, vsn_maint,
            "Copyright (c) 1993, 2012 Michael J. Roberts");
    tcdptf(vsnbuf);
    sprintf(vsnbuf, "TADS for %s [%s] patchlevel %s.%s\n",
            OS_SYSTEM_LDESC, OS_SYSTEM_NAME,
            TADS_OEM_VERSION, OS_SYSTEM_PATCHSUBLVL);
    tcdptf(vsnbuf);
    tcdptf("%s maintains this port.\n", TADS_OEM_NAME);
    
    ERRBEGIN(&errctx)
        tcdmain1(&errctx, argc, argv, &errcbcx, save_ext);
    ERRCATCH(&errctx, err)
        if (err != ERR_USAGE)
            errclog(&errctx);
    
        if (errctx.errcxfp) osfcls(errctx.errcxfp);
        if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);
        /* os_expause(); */
        maybe_pause();
        return(OSEXFAIL);
    ERREND(&errctx)

    /* close message file */
    if (errctx.errcxfp) osfcls(errctx.errcxfp);

    /* close error echo file if any */
    if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);

    /* os_expause(); */
    maybe_pause();
    return(errcbcx.tcderrcnt == 0 ? OSEXSUCC : OSEXFAIL);
}